

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_handle.c
# Opt level: O2

log_record log_handle_pop(log_handle handle)

{
  log_record plVar1;
  size_t sVar2;
  size_t sVar3;
  ulong __size;
  
  if (handle->count == 0) {
LAB_00105215:
    plVar1 = (log_record)0x0;
  }
  else {
    plVar1 = handle->buffer;
    __size = handle->size >> 1;
    sVar3 = handle->count - 1;
    handle->count = sVar3;
    if (sVar3 < __size && 0x1ff < handle->size) {
      plVar1 = (log_record)realloc(plVar1,__size);
      if (plVar1 == (log_record)0x0) goto LAB_00105215;
      handle->buffer = plVar1;
      handle->size = __size;
      sVar3 = handle->count;
    }
    sVar2 = log_record_size();
    plVar1 = (log_record)((long)&plVar1->time + sVar2 * sVar3);
  }
  return plVar1;
}

Assistant:

log_record log_handle_pop(log_handle handle)
{
	if (handle->count > 0)
	{
		const size_t new_size = handle->size >> 0x01;

		--handle->count;

		if (new_size >= LOG_HANDLE_RECORD_SIZE_DEFAULT && handle->count < new_size)
		{
			register void *buffer = realloc(handle->buffer, new_size);

			if (buffer == NULL)
			{
				return NULL;
			}

			handle->buffer = buffer;

			handle->size = new_size;
		}

		return (void *const)((unsigned char *)(handle->buffer) + (handle->count * log_record_size()));
	}

	return NULL;
}